

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderLibrary.cpp
# Opt level: O2

MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *
vkt::anon_unknown_0::allocateAndBindMemory
          (MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *__return_storage_ptr__,
          Context *context,VkBuffer buffer,MemoryRequirement memReqs)

{
  Allocation *pAVar1;
  DeviceInterface *vk;
  VkDevice pVVar2;
  Allocator *pAVar3;
  VkMemoryRequirements bufReqs;
  VkMemoryRequirements VStack_48;
  
  vk = Context::getDeviceInterface(context);
  pVVar2 = Context::getDevice(context);
  ::vk::getBufferMemoryRequirements(&VStack_48,vk,pVVar2,buffer);
  pAVar3 = Context::getDefaultAllocator(context);
  (*pAVar3->_vptr_Allocator[3])(__return_storage_ptr__,pAVar3,&VStack_48,(ulong)memReqs.m_flags);
  pVVar2 = Context::getDevice(context);
  pAVar1 = (__return_storage_ptr__->
           super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>).m_data.ptr;
  (*vk->_vptr_DeviceInterface[0xc])
            (vk,pVVar2,buffer.m_internal,(pAVar1->m_memory).m_internal,pAVar1->m_offset);
  return __return_storage_ptr__;
}

Assistant:

MovePtr<vk::Allocation> allocateAndBindMemory (Context& context, vk::VkBuffer buffer, vk::MemoryRequirement memReqs)
{
	const vk::DeviceInterface&		vkd		= context.getDeviceInterface();
	const vk::VkMemoryRequirements	bufReqs	= vk::getBufferMemoryRequirements(vkd, context.getDevice(), buffer);
	MovePtr<vk::Allocation>			memory	= context.getDefaultAllocator().allocate(bufReqs, memReqs);

	vkd.bindBufferMemory(context.getDevice(), buffer, memory->getMemory(), memory->getOffset());

	return memory;
}